

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::anon_unknown_25::CppCodeGenerator::~CppCodeGenerator(CppCodeGenerator *this)

{
  CppCodeGenerator *this_local;
  
  ~CppCodeGenerator(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateCPP(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }